

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

ostream * wasm::operator<<(ostream *os,Printed *printed)

{
  ostream *poVar1;
  TypePrinter local_c8;
  function<wasm::TypeNames_(wasm::HeapType)> local_40;
  
  std::function<wasm::TypeNames_(wasm::HeapType)>::function(&local_40,&printed->generateName);
  anon_unknown_0::TypePrinter::TypePrinter(&local_c8,os,&local_40);
  poVar1 = anon_unknown_0::TypePrinter::print(&local_c8,(HeapType)printed->typeID);
  anon_unknown_0::TypePrinter::~TypePrinter(&local_c8);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, HeapType::Printed printed) {
  return TypePrinter(os, printed.generateName).print(HeapType(printed.typeID));
}